

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype1.cpp
# Opt level: O1

int main(void)

{
  Maze *pMVar1;
  Wall *this;
  Room *this_00;
  Door *pDVar2;
  ostream *poVar3;
  BombedWall *this_01;
  RoomWithABomb *this_02;
  MazeGame game;
  MazePrototypeFactory bombedMazeFactory;
  MazePrototypeFactory simpleMazeFactory;
  undefined **local_80;
  MazePrototypeFactory local_78 [40];
  MazePrototypeFactory local_50 [40];
  
  local_80 = &PTR_MakeMaze_00103d58;
  pMVar1 = (Maze *)operator_new(0x10);
  Maze::Maze(pMVar1);
  this = (Wall *)operator_new(8);
  Wall::Wall(this);
  this_00 = (Room *)operator_new(0x30);
  Room::Room(this_00,0);
  pDVar2 = (Door *)operator_new(0x18);
  Door::Door(pDVar2);
  MazePrototypeFactory::MazePrototypeFactory(local_50,pMVar1,this,this_00,pDVar2);
  MazeGame::CreateMaze((MazeFactory *)&local_80);
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pMVar1 = (Maze *)operator_new(0x10);
  Maze::Maze(pMVar1);
  this_01 = (BombedWall *)operator_new(0x10);
  BombedWall::BombedWall(this_01);
  this_02 = (RoomWithABomb *)operator_new(0x30);
  RoomWithABomb::RoomWithABomb(this_02,0,false);
  pDVar2 = (Door *)operator_new(0x18);
  Door::Door(pDVar2);
  MazePrototypeFactory::MazePrototypeFactory(local_78,pMVar1,(Wall *)this_01,(Room *)this_02,pDVar2)
  ;
  return 0;
}

Assistant:

int main()
{
    MazeGame game;

    MazePrototypeFactory simpleMazeFactory(
        new Maze, new Wall, new Room, new Door
    );
    Maze* maze = game.CreateMaze(simpleMazeFactory);
    std::cout << maze << std::endl;

    MazePrototypeFactory bombedMazeFactory(
        new Maze, new BombedWall,
        new RoomWithABomb, new Door
    );
}